

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(WordEmbedding *a,WordEmbedding *b)

{
  string *psVar1;
  size_t __n;
  string *psVar2;
  bool bVar3;
  int iVar4;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  bVar3 = std::operator!=((a->language_).ptr_,(b->language_).ptr_);
  if (!bVar3) {
    psVar1 = (a->modelparameterdata_).ptr_;
    __n = psVar1->_M_string_length;
    psVar2 = (b->modelparameterdata_).ptr_;
    if ((__n == psVar2->_M_string_length) &&
       ((__n == 0 ||
        (iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n), iVar4 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline ::google::protobuf::uint32 WordEmbedding::revision() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CoreMLModels.WordEmbedding.revision)
  return revision_;
}